

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O3

void __thiscall leveldb::IteratorWrapper::SeekToFirst(IteratorWrapper *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t extraout_RDX;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->iter_ == (Iterator *)0x0) {
    __assert_fail("iter_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/iterator_wrapper.h"
                  ,0x43,"void leveldb::IteratorWrapper::SeekToFirst()");
  }
  (*this->iter_->_vptr_Iterator[3])();
  iVar2 = (*this->iter_->_vptr_Iterator[2])();
  this->valid_ = SUB41(iVar2,0);
  if (SUB41(iVar2,0) != false) {
    iVar2 = (*this->iter_->_vptr_Iterator[8])();
    (this->key_).data_ = (char *)CONCAT44(extraout_var,iVar2);
    (this->key_).size_ = extraout_RDX;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SeekToFirst() {
    assert(iter_);
    iter_->SeekToFirst();
    Update();
  }